

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O1

char * read_word(int wantbrace)

{
  uint __c;
  int iVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  int length;
  ulong uVar6;
  bool bVar7;
  
  do {
    while( true ) {
      __c = getc((FILE *)fin);
      if (((int)__c < 0) && (iVar1 = feof((FILE *)fin), iVar1 != 0)) {
        return (char *)0x0;
      }
      if (__c != 10) break;
LAB_001980cc:
      lineno = lineno + 1;
    }
    if (__c == 0x23) {
      do {
        iVar1 = getc((FILE *)fin);
        if (iVar1 < 0) break;
      } while (iVar1 != 10);
      goto LAB_001980cc;
    }
    iVar1 = isspace(__c & 0xff);
  } while (iVar1 != 0);
  expand_buffer(100);
  pcVar5 = buffer;
  if (wantbrace == 0 && __c == 0x7b) {
    iVar1 = getc((FILE *)fin);
    iVar4 = 0;
    lVar3 = 0;
    while (-1 < iVar1) {
      if (iVar1 < 0x5c) {
        if (iVar1 != 0x23) {
          if (iVar1 == 10) {
            lineno = lineno + 1;
            iVar1 = 10;
          }
          goto LAB_00198198;
        }
        do {
          iVar1 = getc((FILE *)fin);
          if (iVar1 < 0) break;
        } while (iVar1 != 10);
        lineno = lineno + 1;
      }
      else {
        if (iVar1 == 0x5c) {
          iVar1 = read_quoted();
          if (iVar1 < 0) goto LAB_00198162;
        }
        else if (iVar1 == 0x7b) {
          iVar4 = iVar4 + 1;
          iVar1 = 0x7b;
        }
        else if (iVar1 == 0x7d) {
          iVar1 = 0x7d;
          bVar7 = iVar4 == 0;
          iVar4 = iVar4 + -1;
          if (bVar7) goto LAB_001981bc;
        }
LAB_00198198:
        buffer[lVar3] = (char)iVar1;
        lVar3 = lVar3 + 1;
        expand_buffer((int)lVar3);
      }
LAB_00198162:
      iVar1 = getc((FILE *)fin);
    }
    read_error("Missing \'}\'");
LAB_001981bc:
    uVar6 = (ulong)(int)lVar3;
  }
  else {
    if ((__c == 0x7b) || (__c == 0x7d)) {
      *buffer = (char)__c;
      pcVar2 = pcVar5 + 1;
      goto LAB_0019823d;
    }
    uVar6 = 0;
LAB_001981cb:
    if (__c == 0x5c) goto code_r0x001981d0;
    if ((((-1 < (int)__c) && (iVar1 = isspace(__c & 0xff), iVar1 == 0)) && (__c != 0x23)) &&
       ((__c != 0x7b && (__c != 0x7d)))) goto LAB_001981fc;
    ungetc(__c,(FILE *)fin);
    uVar6 = uVar6 & 0xffffffff;
  }
  pcVar2 = buffer + uVar6;
  pcVar5 = buffer;
LAB_0019823d:
  *pcVar2 = '\0';
  return pcVar5;
code_r0x001981d0:
  __c = read_quoted();
  if (-1 < (int)__c) {
LAB_001981fc:
    buffer[uVar6] = (char)__c;
    uVar6 = uVar6 + 1;
    expand_buffer((int)uVar6);
    __c = getc((FILE *)fin);
  }
  goto LAB_001981cb;
}

Assistant:

const char *read_word(int wantbrace) {
  int x;

  // skip all the whitespace before it:
  for (;;) {
    x = getc(fin);
    if (x < 0 && feof(fin)) {	// eof
      return 0;
    } else if (x == '#') {	// comment
      do x = getc(fin); while (x >= 0 && x != '\n');
      lineno++;
      continue;
    } else if (x == '\n') {
      lineno++;
    } else if (!isspace(x & 255)) {
      break;
    }
  }

  expand_buffer(100);

  if (x == '{' && !wantbrace) {

    // read in whatever is between braces
    int length = 0;
    int nesting = 0;
    for (;;) {
      x = getc(fin);
      if (x<0) {read_error("Missing '}'"); break;}
      else if (x == '#') { // embedded comment
	do x = getc(fin); while (x >= 0 && x != '\n');
	lineno++;
	continue;
      } else if (x == '\n') lineno++;
      else if (x == '\\') {x = read_quoted(); if (x<0) continue;}
      else if (x == '{') nesting++;
      else if (x == '}') {if (!nesting--) break;}
      buffer[length++] = x;
      expand_buffer(length);
    }
    buffer[length] = 0;
    return buffer;

  } else if (x == '{' || x == '}') {
    // all the punctuation is a word:
    buffer[0] = x;
    buffer[1] = 0;
    return buffer;

  } else {

    // read in an unquoted word:
    int length = 0;
    for (;;) {
      if (x == '\\') {x = read_quoted(); if (x<0) continue;}
      else if (x<0 || isspace(x & 255) || x=='{' || x=='}' || x=='#') break;
      buffer[length++] = x;
      expand_buffer(length);
      x = getc(fin);
    }
    ungetc(x, fin);
    buffer[length] = 0;
    return buffer;

  }
}